

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

void __thiscall CoreML::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,string *description)

{
  element_type *this_00;
  string *description_local;
  OneHotEncoder *this_local;
  
  Model::Model(&this->super_Model,description);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__OneHotEncoder_006306c8;
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  Specification::Model::mutable_onehotencoder(this_00);
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const std::string& description) :
    Model(description) {
        // make sure we become a one hot encoder
        (void) m_spec->mutable_onehotencoder();
    }